

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   LogicalType *params_1,LogicalType *params_2)

{
  string *in_RCX;
  string *in_RDX;
  LogicalType *in_RSI;
  string *in_RDI;
  string *in_R8;
  value_type *in_stack_fffffffffffffec8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_fffffffffffffed0;
  string *value;
  string local_b8 [48];
  string local_88 [48];
  LogicalType *in_stack_ffffffffffffffa8;
  LogicalType *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  
  value = in_RDX;
  ::std::__cxx11::string::string(local_88,in_RCX);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>(value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0xe69d0c);
  ::std::__cxx11::string::~string(local_88);
  ::std::__cxx11::string::string(local_b8,in_R8);
  LogicalType::LogicalType((LogicalType *)in_RDX,in_RSI);
  LogicalType::LogicalType((LogicalType *)in_RDX,in_RSI);
  ConstructMessageRecursive<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  LogicalType::~LogicalType((LogicalType *)0xe69d97);
  LogicalType::~LogicalType((LogicalType *)0xe69da1);
  ::std::__cxx11::string::~string(local_b8);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}